

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManSolve(Cbs2_Man_t *p,int iLit)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p_00;
  undefined8 uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  long lVar7;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x570,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
      (p->Pars).nJustThis = 0;
      (p->Pars).nBTThis = 0;
      (p->Pars).nBTThisNc = 0;
      Cbs2_ManAssign(p,iLit,0,0,0);
      iVar4 = Cbs2_ManSolve_rec(p,0);
      uVar6 = 1;
      if (iVar4 == 0) {
        iVar4 = Cbs2_ManCheckLimits(p);
        if (iVar4 == 0) {
          p_00 = p->vModel;
          p_00->nSize = 0;
          (p->pProp).iHead = 0;
          uVar6 = 0;
          for (lVar7 = 0;
              (lVar7 < (p->pProp).iTail && (iVar4 = (p->pProp).pData[lVar7], iVar4 != 0));
              lVar7 = lVar7 + 1) {
            iVar4 = Abc_Lit2Var(iVar4);
            pGVar5 = Gia_ManObj(p->pAig,iVar4);
            if ((~*(uint *)pGVar5 & 0x9fffffff) == 0) {
              pGVar5 = Gia_ManObj(p->pAig,iVar4);
              uVar3 = *(undefined8 *)pGVar5;
              if (-1 < (int)uVar3) {
                __assert_fail("pObj->fTerm",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
              }
              iVar4 = Cbs2_VarValue(p,iVar4);
              iVar4 = Abc_Var2Lit((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff,(uint)(iVar4 == 0));
              Vec_IntPush(p_00,iVar4);
            }
          }
        }
      }
      Cbs2_ManCancelUntil(p,0);
      Cbs2_ManCleanWatch(p);
      Cbs2_ManBumpClean(p);
      (p->pJust).iHead = 0;
      (p->pJust).iTail = 0;
      (p->pClauses).iHead = 1;
      (p->pClauses).iTail = 1;
      iVar4 = (p->Pars).nJustThis;
      piVar1 = &(p->Pars).nBTTotal;
      *piVar1 = *piVar1 + (p->Pars).nBTThis;
      iVar2 = (p->Pars).nJustTotal;
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      (p->Pars).nJustTotal = iVar4;
      iVar4 = Cbs2_ManCheckLimits(p);
      return -(uint)(iVar4 != 0) | uVar6;
    }
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x572,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                ,0x571,"int Cbs2_ManSolve(Cbs2_Man_t *, int)");
}

Assistant:

int Cbs2_ManSolve( Cbs2_Man_t * p, int iLit )
{
    int RetValue = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs2_ManAssign( p, iLit, 0, 0, 0 );
    if ( !Cbs2_ManSolve_rec(p, 0) && !Cbs2_ManCheckLimits(p) )
        Cbs2_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs2_ManCancelUntil( p, 0 );
    Cbs2_ManCleanWatch( p );
    Cbs2_ManBumpClean( p );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs2_ManCheckLimits( p ) )
        RetValue = -1;
    return RetValue;
}